

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int luaV_lessthan(lua_State *L,TValue *l,TValue *r)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  
  uVar2 = l->tt;
  uVar1 = r->tt;
  if (uVar2 == uVar1) {
    if (uVar2 == 4) {
      uVar2 = l_strcmp(&((l->value).gc)->ts,&((r->value).gc)->ts);
      return uVar2 >> 0x1f;
    }
    if (uVar2 == 3) {
      return (uint)((l->value).n <= (r->value).n && (r->value).n != (l->value).n);
    }
    iVar3 = call_orderTM(L,l,r,TM_LT);
    if (iVar3 != -1) {
      return iVar3;
    }
    uVar2 = l->tt;
    uVar1 = r->tt;
  }
  luaG_ordererror(L,(TValue *)(ulong)uVar2,(TValue *)(ulong)uVar1);
  return 0;
}

Assistant:

static int luaV_lessthan(lua_State*L,const TValue*l,const TValue*r){
int res;
if(ttype(l)!=ttype(r))
return luaG_ordererror(L,l,r);
else if(ttisnumber(l))
return luai_numlt(nvalue(l),nvalue(r));
else if(ttisstring(l))
return l_strcmp(rawtsvalue(l),rawtsvalue(r))<0;
else if((res=call_orderTM(L,l,r,TM_LT))!=-1)
return res;
return luaG_ordererror(L,l,r);
}